

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::CreatePhiInstruction
          (ReplaceDescArrayAccessUsingVarIndex *this,BasicBlock *parent_block,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *phi_operands,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *case_block_ids,
          uint32_t default_block_id)

{
  uint32_t uVar1;
  pointer puVar2;
  DefUseManager *this_00;
  Instruction *pIVar3;
  pointer puVar4;
  long lVar5;
  size_t i;
  ulong uVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> incomings;
  InstructionBuilder builder;
  uint32_t local_74;
  BasicBlock *local_70;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  InstructionBuilder local_50;
  
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar4 = (case_block_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
           .super__Vector_impl_data._M_start;
  puVar2 = (case_block_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  local_74 = default_block_id;
  local_70 = parent_block;
  if (((long)puVar2 - (long)puVar4 >> 2) + 1 ==
      (long)(phi_operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(phi_operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2) {
    lVar5 = 0;
    for (uVar6 = 0; uVar6 < (ulong)((long)puVar2 - (long)puVar4 >> 2); uVar6 = uVar6 + 1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,
                 (value_type_conflict *)
                 ((long)(phi_operands->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar5));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,
                 (value_type_conflict *)
                 ((long)(case_block_ids->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar5));
      puVar4 = (case_block_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      puVar2 = (case_block_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      lVar5 = lVar5 + 4;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,
               (phi_operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_finish + -1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,&local_74);
    InstructionBuilder::InstructionBuilder
              (&local_50,(this->super_Pass).context_,
               (local_70->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
               super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_,
               (uint)(anonymous_namespace)::kAnalysisDefUseAndInstrToBlockMapping * 3);
    this_00 = IRContext::get_def_use_mgr((this->super_Pass).context_);
    pIVar3 = analysis::DefUseManager::GetDef
                       (this_00,*(phi_operands->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_start);
    uVar1 = Instruction::type_id(pIVar3);
    pIVar3 = InstructionBuilder::AddPhi
                       (&local_50,uVar1,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,0);
    uVar1 = Instruction::result_id(pIVar3);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_68);
    return uVar1;
  }
  __assert_fail("case_block_ids.size() + 1 == phi_operands.size() && \"Number of Phi operands must be exactly 1 bigger than the one of case \" \"blocks\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/replace_desc_array_access_using_var_index.cpp"
                ,0x194,
                "uint32_t spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::CreatePhiInstruction(BasicBlock *, const std::vector<uint32_t> &, const std::vector<uint32_t> &, uint32_t) const"
               );
}

Assistant:

uint32_t ReplaceDescArrayAccessUsingVarIndex::CreatePhiInstruction(
    BasicBlock* parent_block, const std::vector<uint32_t>& phi_operands,
    const std::vector<uint32_t>& case_block_ids,
    uint32_t default_block_id) const {
  std::vector<uint32_t> incomings;
  assert(case_block_ids.size() + 1 == phi_operands.size() &&
         "Number of Phi operands must be exactly 1 bigger than the one of case "
         "blocks");
  for (size_t i = 0; i < case_block_ids.size(); ++i) {
    incomings.push_back(phi_operands[i]);
    incomings.push_back(case_block_ids[i]);
  }
  incomings.push_back(phi_operands.back());
  incomings.push_back(default_block_id);

  InstructionBuilder builder{context(), &*parent_block->begin(),
                             kAnalysisDefUseAndInstrToBlockMapping};
  uint32_t phi_result_type_id =
      context()->get_def_use_mgr()->GetDef(phi_operands[0])->type_id();
  auto* phi = builder.AddPhi(phi_result_type_id, incomings);
  return phi->result_id();
}